

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

int GetOutput(FILE *fp,Output *op)

{
  void *in_RSI;
  FILE *in_RDI;
  
  fread(in_RSI,0x38,1,in_RDI);
  return 0;
}

Assistant:

int GetOutput(FILE* fp, Output &op) {
    fread(&op, sizeof(op), 1, fp);
    // cout << setprecision(15);
    // cout << op.gx << "   " << op.gy << "   " << op.gz << endl;
    // op.gx = Deg2Rad(op.gx);
    // op.gy = Deg2Rad(op.gy);
    // op.gz = Deg2Rad(op.gz);
    return 0;
}